

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

void __thiscall juzzlin::SimpleLogger::Impl::~Impl(Impl *this)

{
  Impl *in_RDI;
  
  flush(in_RDI);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&in_RDI->m_message);
  std::__cxx11::string::~string((string *)&in_RDI->m_tag);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1080c4);
  return;
}

Assistant:

SimpleLogger::Impl::~Impl()
{
    flush();
}